

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

void __thiscall QPDF::removeSecurityRestrictions(QPDF *this)

{
  bool bVar1;
  bool local_102;
  QPDFObjectHandle local_f0;
  allocator<char> local_d9;
  string local_d8;
  byte local_b3;
  byte local_b2;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  QPDFObjectHandle acroform;
  allocator<char> local_41;
  string local_40;
  undefined1 local_20 [8];
  QPDFObjectHandle root;
  QPDF *this_local;
  
  root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  getRoot((QPDF *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"/Perms",&local_41);
  QPDFObjectHandle::removeKey((QPDFObjectHandle *)local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"/AcroForm",&local_89);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_68,(string *)local_20);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  local_b2 = 0;
  local_b3 = 0;
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_68);
  local_102 = false;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_b2 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"/SigFlags",&local_b1);
    local_b3 = 1;
    local_102 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_68,&local_b0);
  }
  if ((local_b3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b0);
  }
  if ((local_b2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_b1);
  }
  if (local_102 != false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"/SigFlags",&local_d9);
    QPDFObjectHandle::newInteger(&local_f0,0);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_68,&local_d8,&local_f0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_f0);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_68);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_20);
  return;
}

Assistant:

void
QPDF::removeSecurityRestrictions()
{
    auto root = getRoot();
    root.removeKey("/Perms");
    auto acroform = root.getKey("/AcroForm");
    if (acroform.isDictionary() && acroform.hasKey("/SigFlags")) {
        acroform.replaceKey("/SigFlags", QPDFObjectHandle::newInteger(0));
    }
}